

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  size_t __n;
  Location loc_00;
  undefined8 uVar2;
  char *pcVar3;
  size_type sVar4;
  Result RVar5;
  int iVar6;
  Enum EVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  Location loc;
  string end_label;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Token local_60;
  
  GetToken(&local_60,this);
  sVar4 = local_60.loc.filename.size_;
  pcVar3 = local_60.loc.filename.data_;
  uVar2 = CONCAT71(local_60.loc.field_1.field_1.offset._1_7_,local_60.loc.field_1.field2[0]);
  paVar1 = &local_60.loc.field_1;
  local_60.loc.filename.size_ = 0;
  local_60.loc.field_1.field2[0] = 0;
  local_60.loc.filename.data_ = (char *)paVar1;
  RVar5 = ParseLabelOpt(this,(string *)&local_60);
  EVar7 = Error;
  if (RVar5.enum_ != Error) {
    EVar7 = Ok;
    if (local_60.loc.filename.size_ != 0) {
      __n = begin_label->_M_string_length;
      uStack_80 = (undefined4)sVar4;
      uStack_7c = (undefined4)(sVar4 >> 0x20);
      local_78 = (undefined4)uVar2;
      uStack_74 = (undefined4)((uint7)local_60.loc.field_1._1_7_ >> 0x18);
      uStack_70 = (undefined4)local_60.loc.field_1._8_8_;
      uStack_6c = (undefined4)((ulong)local_60.loc.field_1._8_8_ >> 0x20);
      if (__n == 0) {
        EVar7 = Ok;
        Error(this,0x19f6b8,local_60.loc.filename.data_);
      }
      else {
        if (__n == local_60.loc.filename.size_) {
          iVar6 = bcmp((begin_label->_M_dataplus)._M_p,local_60.loc.filename.data_,__n);
          EVar7 = Ok;
          if (iVar6 == 0) goto LAB_00170ff6;
        }
        EVar7 = Ok;
        loc_00.filename.size_._0_4_ = uStack_80;
        loc_00.filename.data_ = pcVar3;
        loc_00.filename.size_._4_4_ = uStack_7c;
        loc_00.field_1.field_0.line = local_78;
        loc_00.field_1.field_0.first_column = uStack_74;
        loc_00.field_1.field_0.last_column = uStack_70;
        loc_00.field_1._12_4_ = uStack_6c;
        Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",(begin_label->_M_dataplus)._M_p,
              local_60.loc.filename.data_,in_R8,in_R9);
      }
    }
  }
LAB_00170ff6:
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_60.loc.filename.data_ != paVar1) {
    operator_delete(local_60.loc.filename.data_);
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}